

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O0

ngx_int_t ngx_http_fastcgi_process_header(ngx_http_request_t *r)

{
  ngx_http_fastcgi_ctx_t *f_00;
  ngx_hash_t *hash;
  ngx_http_upstream_t *pnVar1;
  ngx_table_elt_t *pnVar2;
  ngx_int_t nVar3;
  u_char *puVar4;
  u_char *puVar5;
  u_char *puVar6;
  ngx_uint_t *pnVar7;
  void *pvVar8;
  long lVar9;
  ngx_array_t *pnVar10;
  undefined8 *puVar11;
  ngx_http_fastcgi_header_t *fh;
  ssize_t len;
  ngx_http_upstream_main_conf_t *umcf;
  ngx_http_fastcgi_split_part_t *part;
  ngx_http_fastcgi_loc_conf_t *flcf;
  ngx_http_upstream_header_t *hh;
  ngx_http_fastcgi_ctx_t *f;
  ngx_http_upstream_t *u;
  ngx_table_elt_t *h;
  ngx_uint_t i;
  ngx_buf_t buf;
  ngx_int_t status;
  ngx_int_t rc;
  ngx_str_t *pattern;
  ngx_str_t *status_line;
  size_t size;
  u_char *part_end;
  u_char *part_start;
  u_char *last;
  u_char *start;
  u_char *msg;
  u_char *p;
  ngx_http_request_t *r_local;
  
  f_00 = (ngx_http_fastcgi_ctx_t *)r->ctx[ngx_http_fastcgi_module.ctx_index];
  hash = (ngx_hash_t *)r->main_conf[ngx_http_upstream_module.ctx_index];
  pnVar1 = r->upstream;
LAB_001c44e5:
  do {
    while( true ) {
      while( true ) {
        if (f_00->state < ngx_http_fastcgi_st_data) {
          f_00->pos = (pnVar1->buffer).pos;
          f_00->last = (pnVar1->buffer).last;
          nVar3 = ngx_http_fastcgi_process_record(r,f_00);
          (pnVar1->buffer).pos = f_00->pos;
          (pnVar1->buffer).last = f_00->last;
          if (nVar3 == -2) {
            return -2;
          }
          if (nVar3 == -1) {
            return 0x28;
          }
          if ((f_00->type != 6) && (f_00->type != 7)) {
            if (3 < r->connection->log->log_level) {
              ngx_log_error_core(4,r->connection->log,0,
                                 "upstream sent unexpected FastCGI record: %ui",f_00->type);
            }
            return 0x28;
          }
          if ((f_00->type == 6) && (f_00->length == 0)) {
            if (3 < r->connection->log->log_level) {
              ngx_log_error_core(4,r->connection->log,0,"upstream prematurely closed FastCGI stdout"
                                );
            }
            return 0x28;
          }
        }
        if (f_00->state != ngx_http_fastcgi_st_padding) break;
        if ((pnVar1->buffer).last <= (pnVar1->buffer).pos + f_00->padding) {
          if ((pnVar1->buffer).pos + f_00->padding == (pnVar1->buffer).last) {
            f_00->state = ngx_http_fastcgi_st_version;
            (pnVar1->buffer).pos = (pnVar1->buffer).last;
            return -2;
          }
          f_00->padding = f_00->padding - ((long)(pnVar1->buffer).last - (long)(pnVar1->buffer).pos)
          ;
          (pnVar1->buffer).pos = (pnVar1->buffer).last;
          return -2;
        }
        f_00->state = ngx_http_fastcgi_st_version;
        (pnVar1->buffer).pos = (pnVar1->buffer).pos + f_00->padding;
      }
      if (f_00->type == 7) break;
      if ((((byte)f_00->field_0x40 >> 1 & 1) != 0) && (r->cache != (ngx_http_cache_t *)0x0)) {
        puVar5 = (pnVar1->buffer).start + r->cache->header_start;
        puVar6 = (pnVar1->buffer).pos + (-0x10 - (long)puVar5);
        if ((long)puVar6 < 0) {
          r->cache->header_start =
               (size_t)((pnVar1->buffer).pos + r->cache->header_start + (-8 - (long)puVar5));
        }
        else {
          *puVar5 = '\x01';
          puVar5[1] = '\a';
          puVar5[2] = '\0';
          puVar5[3] = '\x01';
          puVar5[4] = (u_char)((ulong)puVar6 >> 8);
          puVar5[5] = (u_char)puVar6;
          puVar5[6] = '\0';
          puVar5[7] = '\0';
        }
        f_00->field_0x40 = f_00->field_0x40 & 0xfd;
      }
      f_00->field_0x40 = f_00->field_0x40 & 0xfe | 1;
      puVar5 = (pnVar1->buffer).pos;
      if ((pnVar1->buffer).pos + f_00->length < (pnVar1->buffer).last) {
        part_start = (pnVar1->buffer).last;
        (pnVar1->buffer).last = (pnVar1->buffer).pos + f_00->length;
      }
      else {
        part_start = (u_char *)0x0;
      }
      do {
        puVar6 = (pnVar1->buffer).pos;
        puVar4 = (pnVar1->buffer).last;
        status = ngx_http_parse_header_line(r,&pnVar1->buffer,1);
        if ((r->connection->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,r->connection->log,0,"http fastcgi parser: %i",status);
        }
        if (status == -2) break;
        if (status != 0) {
          if (status != 1) {
            if (3 < r->connection->log->log_level) {
              ngx_log_error_core(4,r->connection->log,0,"upstream sent invalid header");
            }
            return 0x28;
          }
          if ((r->connection->log->log_level & 0x100) != 0) {
            ngx_log_error_core(8,r->connection->log,0,"http fastcgi header done");
          }
          if ((pnVar1->headers_in).status == (ngx_table_elt_t *)0x0) {
            if ((pnVar1->headers_in).location == (ngx_table_elt_t *)0x0) {
              (pnVar1->headers_in).status_n = 200;
              (pnVar1->headers_in).status_line.len = 6;
              (pnVar1->headers_in).status_line.data = (u_char *)"200 OK";
            }
            else {
              (pnVar1->headers_in).status_n = 0x12e;
              (pnVar1->headers_in).status_line.len = 0x15;
              (pnVar1->headers_in).status_line.data = (u_char *)"302 Moved Temporarily";
            }
          }
          else {
            pnVar2 = (pnVar1->headers_in).status;
            buf._72_8_ = ngx_atoi((pnVar2->value).data,3);
            if (buf._72_8_ == 0xffffffffffffffff) {
              if (3 < r->connection->log->log_level) {
                ngx_log_error_core(4,r->connection->log,0,"upstream sent invalid status \"%V\"",
                                   &pnVar2->value);
              }
              return 0x28;
            }
            (pnVar1->headers_in).status_n = buf._72_8_;
            (pnVar1->headers_in).status_line.len = (pnVar2->value).len;
            (pnVar1->headers_in).status_line.data = (pnVar2->value).data;
          }
          if ((pnVar1->state != (ngx_http_upstream_state_t *)0x0) && (pnVar1->state->status == 0)) {
            pnVar1->state->status = (pnVar1->headers_in).status_n;
          }
          break;
        }
        pnVar7 = (ngx_uint_t *)ngx_list_push(&(pnVar1->headers_in).headers);
        if (pnVar7 == (ngx_uint_t *)0x0) {
          return -1;
        }
        if ((f_00->split_parts == (ngx_array_t *)0x0) || (f_00->split_parts->nelts == 0)) {
          pnVar7[1] = (long)r->header_name_end - (long)r->header_name_start;
          pnVar7[3] = (long)r->header_end - (long)r->header_start;
          pvVar8 = ngx_pnalloc(r->pool,pnVar7[1] + pnVar7[3] + 2 + pnVar7[1]);
          pnVar7[2] = (ngx_uint_t)pvVar8;
          if (pnVar7[2] == 0) {
            return -1;
          }
          pnVar7[4] = pnVar7[2] + pnVar7[1] + 1;
          pnVar7[5] = pnVar7[2] + pnVar7[1] + pnVar7[3] + 2;
          memcpy((void *)pnVar7[2],r->header_name_start,pnVar7[1]);
          *(undefined1 *)(pnVar7[2] + pnVar7[1]) = 0;
          memcpy((void *)pnVar7[4],r->header_start,pnVar7[3]);
          *(undefined1 *)(pnVar7[4] + pnVar7[3]) = 0;
        }
        else {
          pvVar8 = f_00->split_parts->elts;
          status_line = (ngx_str_t *)((pnVar1->buffer).pos + -(long)puVar6);
          for (h = (ngx_table_elt_t *)0x0; h < (ngx_table_elt_t *)f_00->split_parts->nelts;
              h = (ngx_table_elt_t *)((long)&h->hash + 1)) {
            status_line = (ngx_str_t *)
                          ((*(long *)((long)pvVar8 + (long)h * 0x10 + 8) -
                           *(long *)((long)pvVar8 + (long)h * 0x10)) + (long)status_line);
          }
          i = (ngx_uint_t)ngx_pnalloc(r->pool,(size_t)status_line);
          if ((u_char *)i == (u_char *)0x0) {
            return -1;
          }
          msg = (u_char *)i;
          for (h = (ngx_table_elt_t *)0x0; h < (ngx_table_elt_t *)f_00->split_parts->nelts;
              h = (ngx_table_elt_t *)((long)&h->hash + 1)) {
            memcpy(msg,*(void **)((long)pvVar8 + (long)h * 0x10),
                   *(long *)((long)pvVar8 + (long)h * 0x10 + 8) -
                   *(long *)((long)pvVar8 + (long)h * 0x10));
            msg = msg + (*(long *)((long)pvVar8 + (long)h * 0x10 + 8) -
                        *(long *)((long)pvVar8 + (long)h * 0x10));
          }
          memcpy(msg,puVar6,(long)(pnVar1->buffer).pos - (long)puVar6);
          buf.pos = msg + ((long)(pnVar1->buffer).pos - (long)puVar6);
          f_00->split_parts->nelts = 0;
          nVar3 = ngx_http_parse_header_line(r,(ngx_buf_t *)&i,1);
          if (nVar3 != 0) {
            if (1 < r->connection->log->log_level) {
              ngx_log_error_core(2,r->connection->log,0,
                                 "invalid header after joining FastCGI records");
            }
            return -1;
          }
          pnVar7[1] = (long)r->header_name_end - (long)r->header_name_start;
          pnVar7[2] = (ngx_uint_t)r->header_name_start;
          *(undefined1 *)(pnVar7[2] + pnVar7[1]) = 0;
          pnVar7[3] = (long)r->header_end - (long)r->header_start;
          pnVar7[4] = (ngx_uint_t)r->header_start;
          *(undefined1 *)(pnVar7[4] + pnVar7[3]) = 0;
          pvVar8 = ngx_pnalloc(r->pool,pnVar7[1]);
          pnVar7[5] = (ngx_uint_t)pvVar8;
          if (pnVar7[5] == 0) {
            return -1;
          }
          status = 0;
        }
        *pnVar7 = r->header_hash;
        if (pnVar7[1] == r->lowcase_index) {
          memcpy((void *)pnVar7[5],r->lowcase_header,pnVar7[1]);
        }
        else {
          ngx_strlow((u_char *)pnVar7[5],(u_char *)pnVar7[2],pnVar7[1]);
        }
        pvVar8 = ngx_hash_find(hash,*pnVar7,(u_char *)pnVar7[5],pnVar7[1]);
        if ((pvVar8 != (void *)0x0) &&
           (lVar9 = (**(code **)((long)pvVar8 + 0x10))
                              (r,pnVar7,*(undefined8 *)((long)pvVar8 + 0x18)), lVar9 != 0)) {
          return -1;
        }
        if ((r->connection->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,r->connection->log,0,"http fastcgi header: \"%V: %V\"",pnVar7 + 1,
                             pnVar7 + 3);
        }
      } while ((pnVar1->buffer).pos < (pnVar1->buffer).last);
      if (part_start != (u_char *)0x0) {
        (pnVar1->buffer).last = part_start;
      }
      f_00->length = f_00->length - ((long)(pnVar1->buffer).pos - (long)puVar5);
      if (f_00->length == 0) {
        f_00->state = ngx_http_fastcgi_st_padding;
      }
      if (status == 1) {
        return 0;
      }
      if (status != 0) {
        if ((r->connection->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,r->connection->log,0,
                             "upstream split a header line in FastCGI records");
        }
        if (f_00->split_parts == (ngx_array_t *)0x0) {
          pnVar10 = ngx_array_create(r->pool,1,0x10);
          f_00->split_parts = pnVar10;
          if (f_00->split_parts == (ngx_array_t *)0x0) {
            return -1;
          }
        }
        puVar11 = (undefined8 *)ngx_array_push(f_00->split_parts);
        if (puVar11 == (undefined8 *)0x0) {
          return -1;
        }
        *puVar11 = puVar6;
        puVar11[1] = puVar4;
        if ((pnVar1->buffer).last <= (pnVar1->buffer).pos) {
          return -2;
        }
      }
    }
    if (f_00->length != 0) {
      puVar5 = (pnVar1->buffer).pos;
      if ((pnVar1->buffer).last < (pnVar1->buffer).pos + f_00->length) {
        f_00->length = f_00->length - ((long)(pnVar1->buffer).last - (long)(pnVar1->buffer).pos);
        (pnVar1->buffer).pos = (pnVar1->buffer).last;
      }
      else {
        (pnVar1->buffer).pos = (pnVar1->buffer).pos + f_00->length;
        f_00->length = 0;
        f_00->state = ngx_http_fastcgi_st_padding;
      }
      msg = (pnVar1->buffer).pos;
      do {
        puVar6 = msg;
        msg = puVar6 + -1;
        if (msg <= puVar5) break;
      } while ((((*msg == '\n') || (*msg == '\r')) || (*msg == '.')) || (*msg == ' '));
      if (3 < r->connection->log->log_level) {
        ngx_log_error_core(4,r->connection->log,0,"FastCGI sent in stderr: \"%*s\"",
                           (long)puVar6 - (long)puVar5,puVar5);
      }
      pvVar8 = r->loc_conf[ngx_http_fastcgi_module.ctx_index];
      if (*(long *)((long)pvVar8 + 0x230) != 0) {
        lVar9 = **(long **)((long)pvVar8 + 0x230);
        for (h = (ngx_table_elt_t *)0x0;
            h < *(ngx_table_elt_t **)(*(long *)((long)pvVar8 + 0x230) + 8);
            h = (ngx_table_elt_t *)((long)&h->hash + 1)) {
          puVar4 = ngx_strnstr(puVar5,*(char **)(lVar9 + (long)h * 0x10 + 8),
                               (long)puVar6 - (long)puVar5);
          if (puVar4 != (u_char *)0x0) {
            return 0x28;
          }
        }
      }
      if ((pnVar1->buffer).pos == (pnVar1->buffer).last) {
        if ((f_00->field_0x40 & 1) == 0) {
          if (r->cache == (ngx_http_cache_t *)0x0) {
            (pnVar1->buffer).pos = (pnVar1->buffer).start;
          }
          else {
            (pnVar1->buffer).pos = (pnVar1->buffer).start + r->cache->header_start;
          }
          (pnVar1->buffer).last = (pnVar1->buffer).pos;
          f_00->field_0x40 = f_00->field_0x40 & 0xfd | 2;
        }
        return -2;
      }
      goto LAB_001c44e5;
    }
    f_00->state = ngx_http_fastcgi_st_padding;
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_fastcgi_process_header(ngx_http_request_t *r)
{
    u_char                         *p, *msg, *start, *last,
                                   *part_start, *part_end;
    size_t                          size;
    ngx_str_t                      *status_line, *pattern;
    ngx_int_t                       rc, status;
    ngx_buf_t                       buf;
    ngx_uint_t                      i;
    ngx_table_elt_t                *h;
    ngx_http_upstream_t            *u;
    ngx_http_fastcgi_ctx_t         *f;
    ngx_http_upstream_header_t     *hh;
    ngx_http_fastcgi_loc_conf_t    *flcf;
    ngx_http_fastcgi_split_part_t  *part;
    ngx_http_upstream_main_conf_t  *umcf;

    f = ngx_http_get_module_ctx(r, ngx_http_fastcgi_module);

    umcf = ngx_http_get_module_main_conf(r, ngx_http_upstream_module);

    u = r->upstream;

    for ( ;; ) {

        if (f->state < ngx_http_fastcgi_st_data) {

            f->pos = u->buffer.pos;
            f->last = u->buffer.last;

            rc = ngx_http_fastcgi_process_record(r, f);

            u->buffer.pos = f->pos;
            u->buffer.last = f->last;

            if (rc == NGX_AGAIN) {
                return NGX_AGAIN;
            }

            if (rc == NGX_ERROR) {
                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }

            if (f->type != NGX_HTTP_FASTCGI_STDOUT
                && f->type != NGX_HTTP_FASTCGI_STDERR)
            {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unexpected FastCGI record: %ui",
                              f->type);

                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }

            if (f->type == NGX_HTTP_FASTCGI_STDOUT && f->length == 0) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream prematurely closed FastCGI stdout");

                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }
        }

        if (f->state == ngx_http_fastcgi_st_padding) {

            if (u->buffer.pos + f->padding < u->buffer.last) {
                f->state = ngx_http_fastcgi_st_version;
                u->buffer.pos += f->padding;

                continue;
            }

            if (u->buffer.pos + f->padding == u->buffer.last) {
                f->state = ngx_http_fastcgi_st_version;
                u->buffer.pos = u->buffer.last;

                return NGX_AGAIN;
            }

            f->padding -= u->buffer.last - u->buffer.pos;
            u->buffer.pos = u->buffer.last;

            return NGX_AGAIN;
        }


        /* f->state == ngx_http_fastcgi_st_data */

        if (f->type == NGX_HTTP_FASTCGI_STDERR) {

            if (f->length) {
                msg = u->buffer.pos;

                if (u->buffer.pos + f->length <= u->buffer.last) {
                    u->buffer.pos += f->length;
                    f->length = 0;
                    f->state = ngx_http_fastcgi_st_padding;

                } else {
                    f->length -= u->buffer.last - u->buffer.pos;
                    u->buffer.pos = u->buffer.last;
                }

                for (p = u->buffer.pos - 1; msg < p; p--) {
                    if (*p != LF && *p != CR && *p != '.' && *p != ' ') {
                        break;
                    }
                }

                p++;

                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "FastCGI sent in stderr: \"%*s\"", p - msg, msg);

                flcf = ngx_http_get_module_loc_conf(r, ngx_http_fastcgi_module);

                if (flcf->catch_stderr) {
                    pattern = flcf->catch_stderr->elts;

                    for (i = 0; i < flcf->catch_stderr->nelts; i++) {
                        if (ngx_strnstr(msg, (char *) pattern[i].data,
                                        p - msg)
                            != NULL)
                        {
                            return NGX_HTTP_UPSTREAM_INVALID_HEADER;
                        }
                    }
                }

                if (u->buffer.pos == u->buffer.last) {

                    if (!f->fastcgi_stdout) {

                        /*
                         * the special handling the large number
                         * of the PHP warnings to not allocate memory
                         */

#if (NGX_HTTP_CACHE)
                        if (r->cache) {
                            u->buffer.pos = u->buffer.start
                                                     + r->cache->header_start;
                        } else {
                            u->buffer.pos = u->buffer.start;
                        }
#else
                        u->buffer.pos = u->buffer.start;
#endif
                        u->buffer.last = u->buffer.pos;
                        f->large_stderr = 1;
                    }

                    return NGX_AGAIN;
                }

            } else {
                f->state = ngx_http_fastcgi_st_padding;
            }

            continue;
        }


        /* f->type == NGX_HTTP_FASTCGI_STDOUT */

#if (NGX_HTTP_CACHE)

        if (f->large_stderr && r->cache) {
            ssize_t                     len;
            ngx_http_fastcgi_header_t  *fh;

            start = u->buffer.start + r->cache->header_start;

            len = u->buffer.pos - start - 2 * sizeof(ngx_http_fastcgi_header_t);

            /*
             * A tail of large stderr output before HTTP header is placed
             * in a cache file without a FastCGI record header.
             * To workaround it we put a dummy FastCGI record header at the
             * start of the stderr output or update r->cache_header_start,
             * if there is no enough place for the record header.
             */

            if (len >= 0) {
                fh = (ngx_http_fastcgi_header_t *) start;
                fh->version = 1;
                fh->type = NGX_HTTP_FASTCGI_STDERR;
                fh->request_id_hi = 0;
                fh->request_id_lo = 1;
                fh->content_length_hi = (u_char) ((len >> 8) & 0xff);
                fh->content_length_lo = (u_char) (len & 0xff);
                fh->padding_length = 0;
                fh->reserved = 0;

            } else {
                r->cache->header_start += u->buffer.pos - start
                                          - sizeof(ngx_http_fastcgi_header_t);
            }

            f->large_stderr = 0;
        }

#endif

        f->fastcgi_stdout = 1;

        start = u->buffer.pos;

        if (u->buffer.pos + f->length < u->buffer.last) {

            /*
             * set u->buffer.last to the end of the FastCGI record data
             * for ngx_http_parse_header_line()
             */

            last = u->buffer.last;
            u->buffer.last = u->buffer.pos + f->length;

        } else {
            last = NULL;
        }

        for ( ;; ) {

            part_start = u->buffer.pos;
            part_end = u->buffer.last;

            rc = ngx_http_parse_header_line(r, &u->buffer, 1);

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http fastcgi parser: %i", rc);

            if (rc == NGX_AGAIN) {
                break;
            }

            if (rc == NGX_OK) {

                /* a header line has been parsed successfully */

                h = ngx_list_push(&u->headers_in.headers);
                if (h == NULL) {
                    return NGX_ERROR;
                }

                if (f->split_parts && f->split_parts->nelts) {

                    part = f->split_parts->elts;
                    size = u->buffer.pos - part_start;

                    for (i = 0; i < f->split_parts->nelts; i++) {
                        size += part[i].end - part[i].start;
                    }

                    p = ngx_pnalloc(r->pool, size);
                    if (p == NULL) {
                        return NGX_ERROR;
                    }

                    buf.pos = p;

                    for (i = 0; i < f->split_parts->nelts; i++) {
                        p = ngx_cpymem(p, part[i].start,
                                       part[i].end - part[i].start);
                    }

                    p = ngx_cpymem(p, part_start, u->buffer.pos - part_start);

                    buf.last = p;

                    f->split_parts->nelts = 0;

                    rc = ngx_http_parse_header_line(r, &buf, 1);

                    if (rc != NGX_OK) {
                        ngx_log_error(NGX_LOG_ALERT, r->connection->log, 0,
                                      "invalid header after joining "
                                      "FastCGI records");
                        return NGX_ERROR;
                    }

                    h->key.len = r->header_name_end - r->header_name_start;
                    h->key.data = r->header_name_start;
                    h->key.data[h->key.len] = '\0';

                    h->value.len = r->header_end - r->header_start;
                    h->value.data = r->header_start;
                    h->value.data[h->value.len] = '\0';

                    h->lowcase_key = ngx_pnalloc(r->pool, h->key.len);
                    if (h->lowcase_key == NULL) {
                        return NGX_ERROR;
                    }

                } else {

                    h->key.len = r->header_name_end - r->header_name_start;
                    h->value.len = r->header_end - r->header_start;

                    h->key.data = ngx_pnalloc(r->pool,
                                              h->key.len + 1 + h->value.len + 1
                                              + h->key.len);
                    if (h->key.data == NULL) {
                        return NGX_ERROR;
                    }

                    h->value.data = h->key.data + h->key.len + 1;
                    h->lowcase_key = h->key.data + h->key.len + 1
                                     + h->value.len + 1;

                    ngx_memcpy(h->key.data, r->header_name_start, h->key.len);
                    h->key.data[h->key.len] = '\0';
                    ngx_memcpy(h->value.data, r->header_start, h->value.len);
                    h->value.data[h->value.len] = '\0';
                }

                h->hash = r->header_hash;

                if (h->key.len == r->lowcase_index) {
                    ngx_memcpy(h->lowcase_key, r->lowcase_header, h->key.len);

                } else {
                    ngx_strlow(h->lowcase_key, h->key.data, h->key.len);
                }

                hh = ngx_hash_find(&umcf->headers_in_hash, h->hash,
                                   h->lowcase_key, h->key.len);

                if (hh && hh->handler(r, h, hh->offset) != NGX_OK) {
                    return NGX_ERROR;
                }

                ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                               "http fastcgi header: \"%V: %V\"",
                               &h->key, &h->value);

                if (u->buffer.pos < u->buffer.last) {
                    continue;
                }

                /* the end of the FastCGI record */

                break;
            }

            if (rc == NGX_HTTP_PARSE_HEADER_DONE) {

                /* a whole header has been parsed successfully */

                ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                               "http fastcgi header done");

                if (u->headers_in.status) {
                    status_line = &u->headers_in.status->value;

                    status = ngx_atoi(status_line->data, 3);

                    if (status == NGX_ERROR) {
                        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                                      "upstream sent invalid status \"%V\"",
                                      status_line);
                        return NGX_HTTP_UPSTREAM_INVALID_HEADER;
                    }

                    u->headers_in.status_n = status;
                    u->headers_in.status_line = *status_line;

                } else if (u->headers_in.location) {
                    u->headers_in.status_n = 302;
                    ngx_str_set(&u->headers_in.status_line,
                                "302 Moved Temporarily");

                } else {
                    u->headers_in.status_n = 200;
                    ngx_str_set(&u->headers_in.status_line, "200 OK");
                }

                if (u->state && u->state->status == 0) {
                    u->state->status = u->headers_in.status_n;
                }

                break;
            }

            /* there was error while a header line parsing */

            ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                          "upstream sent invalid header");

            return NGX_HTTP_UPSTREAM_INVALID_HEADER;
        }

        if (last) {
            u->buffer.last = last;
        }

        f->length -= u->buffer.pos - start;

        if (f->length == 0) {
            f->state = ngx_http_fastcgi_st_padding;
        }

        if (rc == NGX_HTTP_PARSE_HEADER_DONE) {
            return NGX_OK;
        }

        if (rc == NGX_OK) {
            continue;
        }

        /* rc == NGX_AGAIN */

        ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "upstream split a header line in FastCGI records");

        if (f->split_parts == NULL) {
            f->split_parts = ngx_array_create(r->pool, 1,
                                        sizeof(ngx_http_fastcgi_split_part_t));
            if (f->split_parts == NULL) {
                return NGX_ERROR;
            }
        }

        part = ngx_array_push(f->split_parts);
        if (part == NULL) {
            return NGX_ERROR;
        }

        part->start = part_start;
        part->end = part_end;

        if (u->buffer.pos < u->buffer.last) {
            continue;
        }

        return NGX_AGAIN;
    }
}